

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O0

double __thiscall spatial_region::tilde_w(spatial_region *this,double *g,double *r,double *chi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double kappa;
  double d;
  double a;
  double local_8;
  undefined1 extraout_var [56];
  
  if ((((*in_RCX == 0.0) && (!NAN(*in_RCX))) || (*in_RDX * *in_RSI < 1.0)) ||
     ((1.0 - *in_RDX) * *in_RSI < 1.0)) {
    local_8 = 0.0;
  }
  else {
    dVar4 = 1.0 / (*in_RDX * (1.0 - *in_RDX) * *in_RCX);
    dVar5 = pow(dVar4,0.3333333333333333);
    dVar8 = dVar5 * dVar5;
    dVar1 = *(double *)(in_RDI + 0x40);
    dVar2 = *in_RSI;
    dVar3 = *in_RSI;
    dVar6 = exp((dVar4 * -2.0) / 3.0);
    dVar4 = sqrt((dVar8 + 0.80049) * (dVar8 + 0.80049) * (dVar8 + 0.80049));
    dVar7 = sqrt(dVar4);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = 1.0 - *in_RDX;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *in_RDX * 2.0;
    auVar9 = vfmadd213sd_fma(auVar9,auVar11,ZEXT816(0xbff0000000000000));
    dVar4 = *in_RCX;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar8;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar8;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar8;
    auVar11 = vfmadd213sd_fma(auVar12,auVar16,ZEXT816(0x3ff0000000000000));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = 1.0 - (dVar8 * 0.65) / auVar11._0_8_;
    auVar11 = vfmadd213sd_fma(ZEXT816(0x3fe6aceee0f3cb3e),auVar13,auVar14);
    dVar8 = sqrt(auVar11._0_8_);
    auVar10._0_8_ = sqrt(dVar8);
    auVar10._8_56_ = extraout_var;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = 1.0 / dVar7;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = -(auVar9._0_8_ * dVar4 * dVar5);
    auVar9 = vfmadd213sd_fma(auVar10._0_16_,auVar15,auVar17);
    local_8 = ((dVar1 * 0.0020591) / (dVar2 * dVar3)) * dVar6 * auVar9._0_8_;
  }
  return local_8;
}

Assistant:

double spatial_region::tilde_w(double& g, double& r, double& chi)
{ // \int_0^g w \, dg = W, время нормировано на c/\omega
    /* Используются следующие аппроксимации: Ai'(x) \approx -exp(
     * -2/3*x^(3/2) )/(2*sqrt(pi)) * ( x + 0.70861*(1-0.65*x/(1+x^2))
     * )^(1/4); \int_x^\infty Ai(y) dy \approx exp( -2/3*x^(3/2)
     * )/(sqrt(2*pi))/( x + 0.80049 )^(3/4) */
    if (chi==0||r*g<1||(1-r)*g<1)
    {
        return 0;
    }
    else
    {
        double a;
        double d;
        double kappa;
        d = 1/(r*(1-r)*chi);
        a = pow(d,(double)1/3);
        kappa = a*a;
        // 1/( 137*2*sqrt(pi) ) = 0.0020591
        return 0.0020591*e_s/(g*g)*exp(-2*d/3)*(1/sqrt(sqrt((kappa+0.80049)*(kappa+0.80049)*(kappa+0.80049))) - (2*r*(1-r)-1)*chi*a*sqrt(sqrt(kappa+0.70861*(1-0.65*kappa/(1+kappa*kappa)))));
    }
}